

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

DFA * __thiscall duckdb_re2::Prog::GetDFA(Prog *this,MatchKind kind)

{
  int iVar1;
  long *plVar2;
  undefined8 *puVar3;
  long lVar4;
  undefined1 local_39;
  Prog *local_38;
  undefined1 *local_30;
  Prog **local_28;
  
  plVar2 = (long *)__tls_get_addr(&PTR_024dae48);
  puVar3 = (undefined8 *)__tls_get_addr(&PTR_024d04a0);
  local_38 = this;
  if (kind == kManyMatch) {
    local_28 = &local_38;
    local_30 = &local_39;
    *plVar2 = (long)&local_30;
    *puVar3 = std::once_flag::_Prepare_execution::
              _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
              ::anon_class_1_0_00000001::__invoke;
    iVar1 = pthread_once(&(this->dfa_first_once_)._M_once,__once_proxy);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
  }
  else {
    if (kind != kFirstMatch) {
      local_28 = &local_38;
      local_30 = &local_39;
      *plVar2 = (long)&local_30;
      *puVar3 = std::once_flag::_Prepare_execution::
                _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
                ::anon_class_1_0_00000001::__invoke;
      iVar1 = pthread_once(&(this->dfa_longest_once_)._M_once,__once_proxy);
      if (iVar1 != 0) {
        std::__throw_system_error(iVar1);
      }
      *plVar2 = 0;
      *puVar3 = 0;
      lVar4 = 0xa0;
      goto LAB_01858b42;
    }
    local_28 = &local_38;
    local_30 = &local_39;
    *plVar2 = (long)&local_30;
    *puVar3 = std::once_flag::_Prepare_execution::
              _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
              ::anon_class_1_0_00000001::__invoke;
    iVar1 = pthread_once(&(this->dfa_first_once_)._M_once,__once_proxy);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
  }
  *plVar2 = 0;
  *puVar3 = 0;
  lVar4 = 0x98;
LAB_01858b42:
  return *(DFA **)((long)this->inst_count_ + lVar4 + -0x34);
}

Assistant:

DFA* Prog::GetDFA(MatchKind kind) {
  // For a forward DFA, half the memory goes to each DFA.
  // However, if it is a "many match" DFA, then there is
  // no counterpart with which the memory must be shared.
  //
  // For a reverse DFA, all the memory goes to the
  // "longest match" DFA, because RE2 never does reverse
  // "first match" searches.
  if (kind == kFirstMatch) {
    std::call_once(dfa_first_once_, [](Prog* prog) {
      prog->dfa_first_ = new DFA(prog, kFirstMatch, prog->dfa_mem_ / 2);
    }, this);
    return dfa_first_;
  } else if (kind == kManyMatch) {
    std::call_once(dfa_first_once_, [](Prog* prog) {
      prog->dfa_first_ = new DFA(prog, kManyMatch, prog->dfa_mem_);
    }, this);
    return dfa_first_;
  } else {
    std::call_once(dfa_longest_once_, [](Prog* prog) {
      if (!prog->reversed_)
        prog->dfa_longest_ = new DFA(prog, kLongestMatch, prog->dfa_mem_ / 2);
      else
        prog->dfa_longest_ = new DFA(prog, kLongestMatch, prog->dfa_mem_);
    }, this);
    return dfa_longest_;
  }
}